

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void api_suite::api_signed(void)

{
  value local_16c;
  char input [3];
  undefined4 local_164;
  decoder_type decoder;
  
  input[2] = '\0';
  input[0] = '4';
  input[1] = '2';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<3ul>(&decoder,&input);
  local_16c = decoder.current.code;
  local_164 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x45,"void api_suite::api_signed()",&local_16c,&local_164);
  local_16c = trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&decoder);
  local_164 = 0x2a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("decoder.signed_value<int>()","42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x46,"void api_suite::api_signed()",&local_16c,&local_164);
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}